

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::relocate
          (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *this,qsizetype offset,
          pair<QModelIndex,_QPersistentModelIndex> **data)

{
  pair<QModelIndex,_QPersistentModelIndex> *d_first;
  pair<QModelIndex,_QPersistentModelIndex> *ppVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<std::pair<QModelIndex,QPersistentModelIndex>,long_long>
            (this->ptr,this->size,d_first);
  if (data != (pair<QModelIndex,_QPersistentModelIndex> **)0x0) {
    ppVar1 = *data;
    if ((this->ptr <= ppVar1) && (ppVar1 < this->ptr + this->size)) {
      *data = ppVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }